

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O1

int tcp_dialer_get_nodelay(void *arg,void *buf,size_t *szp,nni_type t)

{
  _Bool b;
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  b = *(_Bool *)((long)arg + 0x19);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  iVar1 = nni_copyout_bool(b,buf,szp,t);
  return iVar1;
}

Assistant:

static int
tcp_dialer_get_nodelay(void *arg, void *buf, size_t *szp, nni_type t)
{
	bool            b;
	nni_tcp_dialer *d = arg;
	nni_mtx_lock(&d->mtx);
	b = d->nodelay;
	nni_mtx_unlock(&d->mtx);
	return (nni_copyout_bool(b, buf, szp, t));
}